

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_frame_size(AV1_COMMON *cm,int frame_size_override,aom_write_bit_buffer *wb)

{
  int iVar1;
  int bits;
  uint bit;
  
  if (frame_size_override != 0) {
    iVar1 = cm->superres_upscaled_height;
    bits = cm->seq_params->num_bits_height;
    aom_wb_write_literal(wb,cm->superres_upscaled_width + -1,cm->seq_params->num_bits_width);
    aom_wb_write_literal(wb,iVar1 + -1,bits);
  }
  if (cm->seq_params->enable_superres != '\0') {
    if (cm->superres_scale_denominator == '\b') {
      aom_wb_write_bit(wb,0);
    }
    else {
      aom_wb_write_bit(wb,1);
      aom_wb_write_literal(wb,cm->superres_scale_denominator - 9,3);
    }
  }
  bit = 1;
  if (cm->superres_upscaled_width == cm->render_width) {
    bit = (uint)(cm->superres_upscaled_height != cm->render_height);
  }
  aom_wb_write_bit(wb,bit);
  if (bit != 0) {
    aom_wb_write_literal(wb,cm->render_width + -1,0x10);
    aom_wb_write_literal(wb,cm->render_height + -1,0x10);
    return;
  }
  return;
}

Assistant:

static inline void write_frame_size(const AV1_COMMON *cm,
                                    int frame_size_override,
                                    struct aom_write_bit_buffer *wb) {
  const int coded_width = cm->superres_upscaled_width - 1;
  const int coded_height = cm->superres_upscaled_height - 1;

  if (frame_size_override) {
    const SequenceHeader *seq_params = cm->seq_params;
    int num_bits_width = seq_params->num_bits_width;
    int num_bits_height = seq_params->num_bits_height;
    aom_wb_write_literal(wb, coded_width, num_bits_width);
    aom_wb_write_literal(wb, coded_height, num_bits_height);
  }

  write_superres_scale(cm, wb);
  write_render_size(cm, wb);
}